

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.h
# Opt level: O0

bool __thiscall
pybind11::detail::optional_caster<std::optional<kratos::EventControl>_>::load
          (optional_caster<std::optional<kratos::EventControl>_> *this,handle src,bool convert)

{
  bool bVar1;
  template_cast_op_type<typename_std::add_rvalue_reference<EventControl_&&>::type> __args;
  undefined1 local_40 [8];
  value_conv inner_caster;
  bool convert_local;
  optional_caster<std::optional<kratos::EventControl>_> *this_local;
  handle src_local;
  
  inner_caster.super_type_caster_base<kratos::EventControl>.super_type_caster_generic.value._7_1_ =
       convert;
  this_local = (optional_caster<std::optional<kratos::EventControl>_> *)src.m_ptr;
  bVar1 = pybind11::handle::operator_cast_to_bool((handle *)&this_local);
  if (bVar1) {
    bVar1 = object_api<pybind11::handle>::is_none((object_api<pybind11::handle> *)&this_local);
    if (bVar1) {
      src_local.m_ptr._7_1_ = true;
    }
    else {
      type_caster<kratos::EventControl,_void>::type_caster
                ((type_caster<kratos::EventControl,_void> *)local_40);
      bVar1 = type_caster_generic::load
                        ((type_caster_generic *)local_40,(handle)this_local,
                         (bool)(inner_caster.super_type_caster_base<kratos::EventControl>.
                                super_type_caster_generic.value._7_1_ & 1));
      if (bVar1) {
        __args = cast_op<kratos::EventControl&&>((make_caster<kratos::EventControl_&&> *)local_40);
        std::optional<kratos::EventControl>::emplace<kratos::EventControl&>(&this->value,__args);
        src_local.m_ptr._7_1_ = true;
      }
      else {
        src_local.m_ptr._7_1_ = false;
      }
    }
  }
  else {
    src_local.m_ptr._7_1_ = false;
  }
  return src_local.m_ptr._7_1_;
}

Assistant:

bool load(handle src, bool convert) {
        if (!src) {
            return false;
        }
        if (src.is_none()) {
            return true;  // default-constructed value is already empty
        }
        value_conv inner_caster;
        if (!inner_caster.load(src, convert))
            return false;

        value.emplace(cast_op<typename T::value_type &&>(std::move(inner_caster)));
        return true;
    }